

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MetainfoSet.h
# Opt level: O0

void __thiscall ser::MetainfoSet::AddMetainfo<bool>(MetainfoSet *this,string *key,bool *value)

{
  undefined8 rhs;
  bool bVar1;
  SerializationException *this_00;
  mapped_type *this_01;
  undefined1 local_98 [8];
  SerializationException exception;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_40 [8];
  string msg;
  bool *value_local;
  string *key_local;
  MetainfoSet *this_local;
  
  msg.field_2._8_8_ = value;
  bVar1 = HasKey(this,key);
  rhs = msg.field_2._8_8_;
  if (!bVar1) {
    this_01 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
              ::operator[](&this->data_,key);
    boost::any::operator=(this_01,(bool *)rhs);
    return;
  }
  std::operator+(&local_60,"Error: metainfo with key = ",key);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                 &local_60," exists already\n");
  std::__cxx11::string::~string((string *)&local_60);
  SerializationException::SerializationException((SerializationException *)local_98);
  SerializationException::Init((SerializationException *)local_98,(string *)local_40);
  this_00 = (SerializationException *)__cxa_allocate_exception(0x28);
  SerializationException::SerializationException(this_00,(SerializationException *)local_98);
  __cxa_throw(this_00,&SerializationException::typeinfo,
              SerializationException::~SerializationException);
}

Assistant:

inline void AddMetainfo(const std::string& key, const ValueType& value)
        {
            // Check that type of meta info is supported
            BOOST_STATIC_ASSERT((   boost::is_same<ValueType, int        >::type::value
                                    || boost::is_same<ValueType, bool       >::type::value
                                    || boost::is_same<ValueType, float      >::type::value
                                    || boost::is_same<ValueType, double     >::type::value
                                    || boost::is_same<ValueType, std::string>::type::value
                                    ));

            // Check that key does not exist yet
            if(HasKey(key))
            {
                std::string msg = "Error: metainfo with key = " + key + " exists already\n";
                SerializationException exception;
                exception.Init(msg);
                throw exception;
            }

            // Set key = value
            data_[key] = value;
        }